

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O2

unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> __thiscall
duckdb::PhysicalBatchCopyToFile::GetLocalSinkState
          (PhysicalBatchCopyToFile *this,ExecutionContext *context)

{
  ThreadContext *pTVar1;
  _func_int **pp_Var2;
  _Head_base<0UL,_duckdb::LocalFunctionData_*,_false> local_30;
  _func_int **local_28;
  
  pTVar1 = context[9].thread;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator*
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             (context + 0x22));
  (*(code *)pTVar1)(&local_30);
  make_uniq<duckdb::FixedBatchCopyLocalState,duckdb::unique_ptr<duckdb::LocalFunctionData,std::default_delete<duckdb::LocalFunctionData>,true>>
            ((duckdb *)&local_28,
             (unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
              *)&local_30);
  pp_Var2 = local_28;
  local_28 = (_func_int **)0x0;
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = pp_Var2;
  if (local_30._M_head_impl != (LocalFunctionData *)0x0) {
    (*(local_30._M_head_impl)->_vptr_LocalFunctionData[1])();
  }
  return (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)
         (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)this;
}

Assistant:

unique_ptr<LocalSinkState> PhysicalBatchCopyToFile::GetLocalSinkState(ExecutionContext &context) const {
	return make_uniq<FixedBatchCopyLocalState>(function.copy_to_initialize_local(context, *bind_data));
}